

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O0

void oonf_log_stderr(oonf_log_handler_entry *entry,oonf_log_parameters *param)

{
  byte *pbVar1;
  _Bool *color;
  oonf_log_parameters *param_local;
  oonf_log_handler_entry *entry_local;
  
  pbVar1 = (byte *)entry->custom;
  if ((pbVar1 != (byte *)0x0) && ((*pbVar1 & 1) != 0)) {
    if (param->severity == LOG_SEVERITY_INFO) {
      fputs("\x1b[0;33m",_stderr);
    }
    else if (param->severity == LOG_SEVERITY_WARN) {
      fputs("\x1b[0;31m",_stderr);
    }
  }
  fputs(param->buffer,_stderr);
  fputc(10,_stderr);
  if (((pbVar1 != (byte *)0x0) && ((*pbVar1 & 1) != 0)) && (param->severity != LOG_SEVERITY_DEBUG))
  {
    fputs("\x1b[0m",_stderr);
  }
  return;
}

Assistant:

void
oonf_log_stderr(struct oonf_log_handler_entry *entry, struct oonf_log_parameters *param) {
  bool *color = entry->custom;

  if (color && *color) {
    switch (param->severity) {
      case LOG_SEVERITY_INFO:
        fputs("\033[0;33m", stderr);
        break;
      case LOG_SEVERITY_WARN:
        fputs("\033[0;31m", stderr);
        break;
      default:
        break;
    }
  }
  fputs(param->buffer, stderr);
  fputc('\n', stderr);
  if (color && *color && param->severity != LOG_SEVERITY_DEBUG) {
    fputs("\033[0m", stderr);
  }
}